

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

bool __thiscall S2Polygon::Contains(S2Polygon *this,S2Polygon *b)

{
  bool bVar1;
  int iVar2;
  S1Interval *this_00;
  S1Interval *y;
  MutableS2ShapeIndex *b_00;
  byte local_71;
  Options local_58;
  S1Interval local_30;
  S2Polygon *local_20;
  S2Polygon *b_local;
  S2Polygon *this_local;
  
  local_20 = b;
  b_local = this;
  bVar1 = S2LatLngRect::Contains(&this->subregion_bound_,&b->bound_);
  if (!bVar1) {
    iVar2 = num_loops(local_20);
    local_71 = 1;
    if (iVar2 != 1) {
      this_00 = S2LatLngRect::lng(&this->bound_);
      y = S2LatLngRect::lng(&local_20->bound_);
      local_30 = S1Interval::Union(this_00,y);
      bVar1 = S1Interval::is_full(&local_30);
      local_71 = bVar1 ^ 0xff;
    }
    if ((local_71 & 1) != 0) {
      this_local._7_1_ = 0;
      goto LAB_004b9b36;
    }
  }
  bVar1 = is_empty(this);
  if ((bVar1) && (bVar1 = is_full(local_20), bVar1)) {
    this_local._7_1_ = 0;
  }
  else {
    b_00 = &local_20->index_;
    S2BooleanOperation::Options::Options(&local_58);
    this_local._7_1_ =
         S2BooleanOperation::Contains
                   (&(this->index_).super_S2ShapeIndex,&b_00->super_S2ShapeIndex,&local_58);
    S2BooleanOperation::Options::~Options(&local_58);
  }
LAB_004b9b36:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool S2Polygon::Contains(const S2Polygon* b) const {
  // It's worth checking bounding rectangles, since they are precomputed.
  // Note that the first bound has been expanded to account for possible
  // numerical errors in the second bound.
  if (!subregion_bound_.Contains(b->bound_)) {
    // It is possible that A contains B even though Bound(A) does not contain
    // Bound(B).  This can only happen when polygon B has at least two outer
    // shells and the union of the two bounds spans all longitudes.  For
    // example, suppose that B consists of two shells with a longitude gap
    // between them, while A consists of one shell that surrounds both shells
    // of B but goes the other way around the sphere (so that it does not
    // intersect the longitude gap).
    //
    // For convenience we just check whether B has at least two loops rather
    // than two outer shells.
    if (b->num_loops() == 1 || !bound_.lng().Union(b->bound_.lng()).is_full()) {
      return false;
    }
  }

  // The following case is not handled by S2BooleanOperation because it only
  // determines whether the boundary of the result is empty (which does not
  // distinguish between the full and empty polygons).
  if (is_empty() && b->is_full()) return false;

  return S2BooleanOperation::Contains(index_, b->index_);
}